

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visit.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_d327d::ToString::visit(ToString *this,FieldBegin fb)

{
  ostream *poVar1;
  
  poVar1 = (ostream *)std::ostream::write(&this->field_0x10,(long)fb.name._ptr);
  poVar1 = std::operator<<(poVar1,'(');
  poVar1 = (ostream *)std::ostream::write((char *)poVar1,(long)fb.tag._ptr);
  std::operator<<(poVar1,"): ");
  return;
}

Assistant:

void visit(mserialize::Visitor::FieldBegin fb)    { _str << fb.name << '(' << fb.tag << "): "; }